

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<soul::Value,_4UL>::push_back
          (ArrayWithPreallocation<soul::Value,_4UL> *this,Value *item)

{
  Value *item_local;
  ArrayWithPreallocation<soul::Value,_4UL> *this_local;
  
  reserve(this,this->numActive + 1);
  soul::Value::Value(this->items + this->numActive,item);
  this->numActive = this->numActive + 1;
  return;
}

Assistant:

void push_back (Item&& item)                            { reserve (numActive + 1); new (items + numActive) Item (std::move (item)); ++numActive; }